

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::load_addresses
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          void **addresses,int address_count)

{
  bool bVar1;
  char **__ptr;
  char **__tmp;
  char **ppcVar2;
  
  if (address_count != 0) {
    ppcVar2 = (char **)backtrace_symbols(addresses,address_count);
    bVar1 = (this->_symbols)._empty;
    (this->_symbols)._empty = ppcVar2 == (char **)0x0;
    __ptr = (this->_symbols)._val;
    (this->_symbols)._val = ppcVar2;
    if (bVar1 == false) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }